

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall QMakeEvaluator::checkRequirements(QMakeEvaluator *this,ProStringList *deps)

{
  ProFile *pPVar1;
  VisitReturn VVar2;
  QList<ProString> *this_00;
  long lVar3;
  ProString *dep;
  ProString *args;
  long in_FS_OFFSET;
  QStringView cond;
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ProKey::ProKey(&local_68,"QMAKE_FAILED_REQUIREMENTS");
  this_00 = &valuesRef(this,&local_68)->super_QList<ProString>;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
  args = (deps->super_QList<ProString>).d.ptr;
  for (lVar3 = (deps->super_QList<ProString>).d.size * 0x30; lVar3 != 0; lVar3 = lVar3 + -0x30) {
    local_68.super_ProString.m_string.d.ptr = (args->m_string).d.ptr;
    local_68.super_ProString.m_string.d.d = (Data *)(args->m_string).d.size;
    cond = QStringView::mid((QStringView *)&local_68,(long)args->m_offset,(long)args->m_length);
    pPVar1 = (this->m_current).pro;
    local_68.super_ProString.m_string.d.d = (pPVar1->m_fileName).d.d;
    local_68.super_ProString.m_string.d.ptr = (pPVar1->m_fileName).d.ptr;
    local_68.super_ProString.m_string.d.size = (pPVar1->m_fileName).d.size;
    if (local_68.super_ProString.m_string.d.d != (Data *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    VVar2 = evaluateConditional(this,cond,(QString *)&local_68,(uint)(this->m_current).line);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68);
    if (VVar2 != ReturnTrue) {
      if (VVar2 == ReturnError) goto LAB_001f8e85;
      QList<ProString>::emplaceBack<ProString_const&>(this_00,args);
    }
    args = args + 1;
  }
  VVar2 = ReturnTrue;
LAB_001f8e85:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar2;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::checkRequirements(const ProStringList &deps)
{
    ProStringList &failed = valuesRef(ProKey("QMAKE_FAILED_REQUIREMENTS"));
    for (const ProString &dep : deps) {
        VisitReturn vr = evaluateConditional(dep.toQStringView(), m_current.pro->fileName(), m_current.line);
        if (vr == ReturnError)
            return ReturnError;
        if (vr != ReturnTrue)
            failed << dep;
    }
    return ReturnTrue;
}